

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void __thiscall Fl_Window::label(Fl_Window *this,char *name,char *iname)

{
  char cVar1;
  Fl_X *pFVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  
  Fl_Widget::label((Fl_Widget *)this,name);
  this->iconlabel_ = iname;
  pFVar2 = this->i;
  if ((pFVar2 != (Fl_X *)0x0) && ((this->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0)
     ) {
    __s = "";
    if (name != (char *)0x0) {
      __s = name;
    }
    sVar3 = strlen(__s);
    if (iname == (char *)0x0) {
      cVar1 = *__s;
      pcVar5 = __s;
      iname = __s;
      while (cVar1 != '\0') {
        pcVar5 = pcVar5 + 1;
        if (cVar1 == '/') {
          iname = pcVar5;
        }
        cVar1 = *pcVar5;
      }
    }
    sVar4 = strlen(iname);
    XChangeProperty(fl_display,pFVar2->xid,fl_NET_WM_NAME,fl_XaUtf8String,8,0,__s,sVar3);
    XChangeProperty(fl_display,this->i->xid,0x27,0x1f,8,0,__s,sVar3);
    XChangeProperty(fl_display,this->i->xid,fl_NET_WM_ICON_NAME,fl_XaUtf8String,8,0,iname,sVar4);
    XChangeProperty(fl_display,this->i->xid,0x25,0x1f,8,0,iname,sVar4);
  }
  return;
}

Assistant:

void Fl_Window::label(const char *name,const char *iname) {
  Fl_Widget::label(name);
  iconlabel_ = iname;
  if (shown() && !parent()) {
    if (!name) name = "";
    int namelen = strlen(name);
    if (!iname) iname = fl_filename_name(name);
    int inamelen = strlen(iname);
    XChangeProperty(fl_display, i->xid, fl_NET_WM_NAME,      fl_XaUtf8String, 8, 0, (uchar*)name,  namelen);	// utf8
    XChangeProperty(fl_display, i->xid, XA_WM_NAME,          XA_STRING,       8, 0, (uchar*)name,  namelen);	// non-utf8
    XChangeProperty(fl_display, i->xid, fl_NET_WM_ICON_NAME, fl_XaUtf8String, 8, 0, (uchar*)iname, inamelen);	// utf8
    XChangeProperty(fl_display, i->xid, XA_WM_ICON_NAME,     XA_STRING,       8, 0, (uchar*)iname, inamelen);	// non-utf8
  }
}